

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase663::run(TestCase663 *this)

{
  bool bVar1;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_common_test_c__:669:5)>
  DVar2;
  bool local_161;
  DebugExpression<bool_&> DStack_160;
  bool _kj_shouldLog_5;
  DebugExpression<bool_&> _kjCondition_5;
  uint local_150;
  DebugExpression<unsigned_int> DStack_14c;
  bool _kj_shouldLog_4;
  undefined1 local_148 [8];
  DebugComparison<unsigned_int,_unsigned_int_&> _kjCondition_4;
  uint local_118;
  DebugExpression<unsigned_int> DStack_114;
  bool _kj_shouldLog_3;
  undefined1 local_110 [8];
  DebugComparison<unsigned_int,_unsigned_int_&> _kjCondition_3;
  uint local_e0;
  bool _kj_shouldLog_2;
  DebugExpression<bool> _kjCondition_2;
  uint local_d8;
  DebugExpression<unsigned_int> DStack_d4;
  bool _kj_shouldLog_1;
  undefined1 local_d0 [8];
  DebugComparison<unsigned_int,_unsigned_int_&> _kjCondition_1;
  uint local_a0;
  DebugExpression<unsigned_int> DStack_9c;
  bool _kj_shouldLog;
  undefined1 local_98 [8];
  DebugComparison<unsigned_int,_unsigned_int_&> _kjCondition;
  uint *local_60;
  undefined1 *local_58;
  undefined1 local_50 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_common_test_c__:670:5)>
  _kjDefer670;
  undefined1 local_30 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_common_test_c__:669:5)>
  _kjDefer669;
  uint local_18;
  bool abStack_14 [3];
  bool k;
  uint j;
  uint i;
  TestCase663 *this_local;
  
  _abStack_14 = 0;
  local_18 = 1;
  _kjDefer669.maybeFunc.ptr.field_1._7_1_ = 0;
  _kjDefer670.maybeFunc.ptr.field_1.value.k = abStack_14;
  _j = this;
  DVar2 = defer<kj::(anonymous_namespace)::TestCase663::run()::__0>
                    ((kj *)local_30,(Type *)&_kjDefer670.maybeFunc.ptr.field_1.value.k);
  local_60 = &local_18;
  local_58 = (undefined1 *)((long)&_kjDefer669.maybeFunc.ptr.field_1 + 7);
  defer<kj::(anonymous_namespace)::TestCase663::run()::__1>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_common_test_c__:670:5)>
              *)local_50,(kj *)&local_60,(Type *)DVar2.maybeFunc.ptr.field_1);
  local_a0 = 0;
  DStack_9c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a0);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int_&> *)local_98,&stack0xffffffffffffff64,
             (uint *)abStack_14);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
  if (!bVar1) {
    _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._39_1_ != '\0') {
      _kjCondition_1.result = false;
      _kjCondition_1._33_3_ = 0;
      kj::_::Debug::
      log<char_const(&)[29],kj::_::DebugComparison<unsigned_int,unsigned_int&>&,unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x29f,ERROR,"\"failed: expected \" \"(0u) == (i)\", _kjCondition, 0u, i",
                 (char (*) [29])"failed: expected (0u) == (i)",
                 (DebugComparison<unsigned_int,_unsigned_int_&> *)local_98,
                 (uint *)&_kjCondition_1.result,(uint *)abStack_14);
      _kjCondition_1._39_1_ = 0;
    }
  }
  local_d8 = 1;
  DStack_d4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int_&> *)local_d0,&stack0xffffffffffffff2c,
             &local_18);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d0);
  if (!bVar1) {
    _kjCondition_2.value = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2.value != false) {
      local_e0 = 1;
      kj::_::Debug::
      log<char_const(&)[29],kj::_::DebugComparison<unsigned_int,unsigned_int&>&,unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x2a0,ERROR,"\"failed: expected \" \"(1u) == (j)\", _kjCondition, 1u, j",
                 (char (*) [29])"failed: expected (1u) == (j)",
                 (DebugComparison<unsigned_int,_unsigned_int_&> *)local_d0,&local_e0,&local_18);
      _kjCondition_2.value = false;
    }
  }
  _kjCondition_3._38_1_ = ~_kjDefer669.maybeFunc.ptr.field_1._7_1_ & 1;
  _kjCondition_3._39_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_3.field_0x26);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_3.field_0x27);
  if (!bVar1) {
    _kjCondition_3._37_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_3._37_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[22],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x2a1,ERROR,"\"failed: expected \" \"!(k)\", _kjCondition",
                 (char (*) [22])"failed: expected !(k)",
                 (DebugExpression<bool> *)&_kjCondition_3.field_0x27);
      _kjCondition_3._37_1_ = 0;
    }
  }
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++:670:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_common_test_c__:670:5)>
               *)local_50);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++:669:5)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_common_test_c__:669:5)>
               *)local_30);
  local_118 = 1;
  DStack_114 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_118);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int_&> *)local_110,&stack0xfffffffffffffeec,
             (uint *)abStack_14);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_110);
  if (!bVar1) {
    _kjCondition_4._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_4._39_1_ != '\0') {
      _kjCondition_4.result = true;
      _kjCondition_4._33_3_ = 0;
      kj::_::Debug::
      log<char_const(&)[29],kj::_::DebugComparison<unsigned_int,unsigned_int&>&,unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x2a4,ERROR,"\"failed: expected \" \"(1u) == (i)\", _kjCondition, 1u, i",
                 (char (*) [29])"failed: expected (1u) == (i)",
                 (DebugComparison<unsigned_int,_unsigned_int_&> *)local_110,
                 (uint *)&_kjCondition_4.result,(uint *)abStack_14);
      _kjCondition_4._39_1_ = 0;
    }
  }
  local_150 = 4;
  DStack_14c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_150);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int_&> *)local_148,&stack0xfffffffffffffeb4,
             &local_18);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_148);
  if (!bVar1) {
    _kjCondition_5.value._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)_kjCondition_5.value._7_1_ != false) {
      _kjCondition_5.value._0_4_ = 4;
      kj::_::Debug::
      log<char_const(&)[29],kj::_::DebugComparison<unsigned_int,unsigned_int&>&,unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x2a5,ERROR,"\"failed: expected \" \"(4u) == (j)\", _kjCondition, 4u, j",
                 (char (*) [29])"failed: expected (4u) == (j)",
                 (DebugComparison<unsigned_int,_unsigned_int_&> *)local_148,(uint *)&_kjCondition_5,
                 &local_18);
      _kjCondition_5.value._7_1_ = false;
    }
  }
  DStack_160 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (bool *)((long)&_kjDefer669.maybeFunc.ptr.field_1 + 7));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&stack0xfffffffffffffea0)
  ;
  if (!bVar1) {
    local_161 = kj::_::Debug::shouldLog(ERROR);
    while (local_161 != false) {
      kj::_::Debug::log<char_const(&)[19],kj::_::DebugExpression<bool&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x2a6,ERROR,"\"failed: expected \" \"k\", _kjCondition",
                 (char (*) [19])"failed: expected k",&stack0xfffffffffffffea0);
      local_161 = false;
    }
  }
  return;
}

Assistant:

TEST(Common, Defer) {
  uint i = 0;
  uint j = 1;
  bool k = false;

  {
    KJ_DEFER(++i);
    KJ_DEFER(j += 3; k = true);
    EXPECT_EQ(0u, i);
    EXPECT_EQ(1u, j);
    EXPECT_FALSE(k);
  }

  EXPECT_EQ(1u, i);
  EXPECT_EQ(4u, j);
  EXPECT_TRUE(k);
}